

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wskey.cpp
# Opt level: O1

void __thiscall Sha1_Test3_Test::~Sha1_Test3_Test(Sha1_Test3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Sha1, Test3) {
    char const test[] = {'a'};
    auto const span = pstore::gsl::make_span (reinterpret_cast<std::uint8_t const *> (test),
                                              pstore::array_elements (test));
    pstore::http::sha1 sha;
    for (auto ctr = 0U; ctr < 1000000U; ++ctr) {
        sha.input (span);
    }
    pstore::http::sha1::result_type const digest = sha.result ();
    EXPECT_THAT (digest, testing::ContainerEq (pstore::http::sha1::result_type{
                             {0x34, 0xAA, 0x97, 0x3C, 0xD4, 0xC4, 0xDA, 0xA4, 0xF6, 0x1E,
                              0xEB, 0x2B, 0xDB, 0xAD, 0x27, 0x31, 0x65, 0x34, 0x01, 0x6F}}));
    EXPECT_EQ (pstore::http::sha1::digest_to_base64 (digest), "NKqXPNTE2qT2Husr260nMWU0AW8=");
}